

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::UnaryAggregateHeap<int,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,int *value)

{
  ulong uVar1;
  HeapEntry<int> *__last;
  HeapEntry<int> *__first;
  
  __first = this->heap;
  uVar1 = this->size;
  if (uVar1 < this->capacity) {
    this->size = uVar1 + 1;
    __last = __first + uVar1 + 1;
    __first[uVar1].value = *value;
  }
  else {
    if (*value <= __first->value) {
      return;
    }
    ::std::
    pop_heap<duckdb::HeapEntry<int>*,bool(*)(duckdb::HeapEntry<int>const&,duckdb::HeapEntry<int>const&)>
              (__first,__first + uVar1,Compare);
    __first = this->heap;
    __last = __first + this->size;
    __last[-1].value = *value;
  }
  ::std::
  push_heap<duckdb::HeapEntry<int>*,bool(*)(duckdb::HeapEntry<int>const&,duckdb::HeapEntry<int>const&)>
            (__first,__last,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}